

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.c
# Opt level: O1

int uv__signal_start(uv_signal_t *handle,uv_signal_cb signal_cb,int signum,int oneshot)

{
  byte *pbVar1;
  uint *puVar2;
  uv__signal_tree_s uVar3;
  uv_signal_t *puVar4;
  uv_signal_t *puVar5;
  int iVar6;
  uint uVar7;
  uv_signal_t *puVar8;
  long lVar9;
  uv_signal_s *puVar10;
  uv_signal_s *puVar11;
  uv_signal_t *puVar12;
  anon_struct_32_4_548b78d9_for_tree_entry *paVar13;
  sigset_t saved_sigmask;
  sigset_t sStack_a8;
  
  if ((handle->flags & 3) != 0) {
    __assert_fail("!uv__is_closing(handle)",
                  "/workspace/llm4binary/github/license_c_cmakelists/xhawk18[P]s_task/libuv/src/unix/signal.c"
                  ,0x16f,"int uv__signal_start(uv_signal_t *, uv_signal_cb, int, int)");
  }
  if (signum == 0) {
    iVar6 = -0x16;
  }
  else if (handle->signum == signum) {
    handle->signal_cb = signal_cb;
    iVar6 = 0;
  }
  else {
    if (handle->signum != 0) {
      uv__signal_stop(handle);
    }
    uv__signal_block_and_lock(&sStack_a8);
    puVar8 = uv__signal_first_handle(signum);
    if (((puVar8 == (uv_signal_t *)0x0) || ((oneshot == 0 && ((puVar8->flags & 0x2000000) != 0))))
       && (iVar6 = uv__signal_register_handler(signum,oneshot), iVar6 != 0)) {
      uv__signal_unlock_and_unblock(&sStack_a8);
    }
    else {
      handle->signum = signum;
      if (oneshot != 0) {
        pbVar1 = (byte *)((long)&handle->flags + 3);
        *pbVar1 = *pbVar1 | 2;
      }
      uVar3.rbh_root = uv__signal_tree.rbh_root;
      if (uv__signal_tree.rbh_root == (uv_signal_s *)0x0) {
        lVar9 = 0x80;
        puVar10 = (uv_signal_t *)0x0;
      }
      else {
        do {
          puVar10 = uVar3.rbh_root;
          uVar7 = uv__signal_compare(handle,puVar10);
          if ((int)uVar7 < 0) {
            lVar9 = 0x78;
          }
          else {
            lVar9 = 0x80;
            if (uVar7 == 0) goto LAB_0011000d;
          }
          uVar3.rbh_root = *(uv_signal_s **)((long)puVar10->handle_queue + lVar9 + -0x28);
        } while (uVar3.rbh_root != (uv_signal_t *)0x0);
        lVar9 = (ulong)(~uVar7 >> 0x1f) * 8 + 0x78;
      }
      (handle->tree_entry).rbe_parent = puVar10;
      (handle->tree_entry).rbe_left = (uv_signal_s *)0x0;
      (handle->tree_entry).rbe_right = (uv_signal_s *)0x0;
      (handle->tree_entry).rbe_color = 1;
      uVar3.rbh_root = handle;
      if (puVar10 != (uv_signal_t *)0x0) {
        *(uv_signal_t **)((long)puVar10->handle_queue + lVar9 + -0x28) = handle;
        puVar8 = handle;
        do {
          uVar3.rbh_root = uv__signal_tree.rbh_root;
          if ((puVar10->tree_entry).rbe_color != 1) break;
          puVar4 = (puVar10->tree_entry).rbe_parent;
          puVar11 = (puVar4->tree_entry).rbe_left;
          if (puVar10 == puVar11) {
            puVar11 = (puVar4->tree_entry).rbe_right;
            if ((puVar11 == (uv_signal_s *)0x0) || ((puVar11->tree_entry).rbe_color != 1)) {
              puVar5 = (puVar10->tree_entry).rbe_right;
              puVar12 = puVar10;
              if (puVar5 == puVar8) {
                puVar11 = (puVar5->tree_entry).rbe_left;
                (puVar10->tree_entry).rbe_right = puVar11;
                if (puVar11 != (uv_signal_s *)0x0) {
                  (puVar11->tree_entry).rbe_parent = puVar10;
                }
                puVar11 = (puVar10->tree_entry).rbe_parent;
                (puVar5->tree_entry).rbe_parent = puVar11;
                paVar13 = (anon_struct_32_4_548b78d9_for_tree_entry *)&uv__signal_tree;
                if (puVar11 != (uv_signal_s *)0x0) {
                  puVar11 = (puVar10->tree_entry).rbe_parent;
                  paVar13 = (anon_struct_32_4_548b78d9_for_tree_entry *)
                            &(puVar11->tree_entry).rbe_right;
                  if (puVar10 == (puVar11->tree_entry).rbe_left) {
                    paVar13 = &puVar11->tree_entry;
                  }
                }
                paVar13->rbe_left = puVar5;
                (puVar5->tree_entry).rbe_left = puVar10;
                (puVar10->tree_entry).rbe_parent = puVar5;
                puVar12 = puVar8;
                puVar8 = puVar10;
              }
              (puVar12->tree_entry).rbe_color = 0;
              (puVar4->tree_entry).rbe_color = 1;
              puVar10 = (puVar4->tree_entry).rbe_left;
              puVar11 = (puVar10->tree_entry).rbe_right;
              (puVar4->tree_entry).rbe_left = puVar11;
              if (puVar11 != (uv_signal_s *)0x0) {
                (puVar11->tree_entry).rbe_parent = puVar4;
              }
              puVar11 = (puVar4->tree_entry).rbe_parent;
              (puVar10->tree_entry).rbe_parent = puVar11;
              paVar13 = (anon_struct_32_4_548b78d9_for_tree_entry *)&uv__signal_tree;
              if (puVar11 != (uv_signal_s *)0x0) {
                puVar11 = (puVar4->tree_entry).rbe_parent;
                paVar13 = (anon_struct_32_4_548b78d9_for_tree_entry *)
                          &(puVar11->tree_entry).rbe_right;
                if (puVar4 == (puVar11->tree_entry).rbe_left) {
                  paVar13 = &puVar11->tree_entry;
                }
              }
              paVar13->rbe_left = puVar10;
              (puVar10->tree_entry).rbe_right = puVar4;
              goto LAB_0010ffd9;
            }
LAB_0010fe15:
            (puVar11->tree_entry).rbe_color = 0;
            (puVar10->tree_entry).rbe_color = 0;
            (puVar4->tree_entry).rbe_color = 1;
            puVar8 = puVar4;
          }
          else {
            if ((puVar11 != (uv_signal_s *)0x0) && ((puVar11->tree_entry).rbe_color == 1))
            goto LAB_0010fe15;
            puVar5 = (puVar10->tree_entry).rbe_left;
            puVar12 = puVar10;
            if (puVar5 == puVar8) {
              puVar11 = (puVar5->tree_entry).rbe_right;
              (puVar10->tree_entry).rbe_left = puVar11;
              if (puVar11 != (uv_signal_s *)0x0) {
                (puVar11->tree_entry).rbe_parent = puVar10;
              }
              puVar11 = (puVar10->tree_entry).rbe_parent;
              (puVar5->tree_entry).rbe_parent = puVar11;
              paVar13 = (anon_struct_32_4_548b78d9_for_tree_entry *)&uv__signal_tree;
              if (puVar11 != (uv_signal_s *)0x0) {
                puVar11 = (puVar10->tree_entry).rbe_parent;
                paVar13 = (anon_struct_32_4_548b78d9_for_tree_entry *)
                          &(puVar11->tree_entry).rbe_right;
                if (puVar10 == (puVar11->tree_entry).rbe_left) {
                  paVar13 = &puVar11->tree_entry;
                }
              }
              paVar13->rbe_left = puVar5;
              (puVar5->tree_entry).rbe_right = puVar10;
              (puVar10->tree_entry).rbe_parent = puVar5;
              puVar12 = puVar8;
              puVar8 = puVar10;
            }
            (puVar12->tree_entry).rbe_color = 0;
            (puVar4->tree_entry).rbe_color = 1;
            puVar10 = (puVar4->tree_entry).rbe_right;
            puVar11 = (puVar10->tree_entry).rbe_left;
            (puVar4->tree_entry).rbe_right = puVar11;
            if (puVar11 != (uv_signal_s *)0x0) {
              (puVar11->tree_entry).rbe_parent = puVar4;
            }
            puVar11 = (puVar4->tree_entry).rbe_parent;
            (puVar10->tree_entry).rbe_parent = puVar11;
            paVar13 = (anon_struct_32_4_548b78d9_for_tree_entry *)&uv__signal_tree;
            if (puVar11 != (uv_signal_s *)0x0) {
              puVar11 = (puVar4->tree_entry).rbe_parent;
              paVar13 = (anon_struct_32_4_548b78d9_for_tree_entry *)&(puVar11->tree_entry).rbe_right
              ;
              if (puVar4 == (puVar11->tree_entry).rbe_left) {
                paVar13 = &puVar11->tree_entry;
              }
            }
            paVar13->rbe_left = puVar10;
            (puVar10->tree_entry).rbe_left = puVar4;
LAB_0010ffd9:
            (puVar4->tree_entry).rbe_parent = puVar10;
          }
          puVar10 = (puVar8->tree_entry).rbe_parent;
          uVar3.rbh_root = uv__signal_tree.rbh_root;
        } while (puVar10 != (uv_signal_s *)0x0);
      }
      uv__signal_tree.rbh_root = uVar3.rbh_root;
      ((uv__signal_tree.rbh_root)->tree_entry).rbe_color = 0;
LAB_0011000d:
      uv__signal_unlock_and_unblock(&sStack_a8);
      handle->signal_cb = signal_cb;
      uVar7 = handle->flags;
      iVar6 = 0;
      if (((uVar7 & 4) == 0) && (handle->flags = uVar7 | 4, (uVar7 & 8) != 0)) {
        puVar2 = &handle->loop->active_handles;
        *puVar2 = *puVar2 + 1;
      }
    }
  }
  return iVar6;
}

Assistant:

static int uv__signal_start(uv_signal_t* handle,
                            uv_signal_cb signal_cb,
                            int signum,
                            int oneshot) {
  sigset_t saved_sigmask;
  int err;
  uv_signal_t* first_handle;

  assert(!uv__is_closing(handle));

  /* If the user supplies signum == 0, then return an error already. If the
   * signum is otherwise invalid then uv__signal_register will find out
   * eventually.
   */
  if (signum == 0)
    return UV_EINVAL;

  /* Short circuit: if the signal watcher is already watching {signum} don't
   * go through the process of deregistering and registering the handler.
   * Additionally, this avoids pending signals getting lost in the small time
   * time frame that handle->signum == 0.
   */
  if (signum == handle->signum) {
    handle->signal_cb = signal_cb;
    return 0;
  }

  /* If the signal handler was already active, stop it first. */
  if (handle->signum != 0) {
    uv__signal_stop(handle);
  }

  uv__signal_block_and_lock(&saved_sigmask);

  /* If at this point there are no active signal watchers for this signum (in
   * any of the loops), it's time to try and register a handler for it here.
   * Also in case there's only one-shot handlers and a regular handler comes in.
   */
  first_handle = uv__signal_first_handle(signum);
  if (first_handle == NULL ||
      (!oneshot && (first_handle->flags & UV_SIGNAL_ONE_SHOT))) {
    err = uv__signal_register_handler(signum, oneshot);
    if (err) {
      /* Registering the signal handler failed. Must be an invalid signal. */
      uv__signal_unlock_and_unblock(&saved_sigmask);
      return err;
    }
  }

  handle->signum = signum;
  if (oneshot)
    handle->flags |= UV_SIGNAL_ONE_SHOT;

  RB_INSERT(uv__signal_tree_s, &uv__signal_tree, handle);

  uv__signal_unlock_and_unblock(&saved_sigmask);

  handle->signal_cb = signal_cb;
  uv__handle_start(handle);

  return 0;
}